

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImGuiIniData * FindWindowSettings(char *name)

{
  uint uVar1;
  ImGuiIniData *pIVar2;
  ImGuiContext *pIVar3;
  ImU32 IVar4;
  ulong uVar5;
  long lVar6;
  
  pIVar3 = GImGui;
  IVar4 = ImHash(name,0,0);
  uVar1 = (pIVar3->Settings).Size;
  if ((ulong)uVar1 != 0) {
    uVar5 = 0;
    if (0 < (int)uVar1) {
      uVar5 = (ulong)uVar1;
    }
    lVar6 = 0;
    do {
      if (uVar5 * 0x20 == lVar6) {
        __assert_fail("i < Size",
                      "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.h"
                      ,0x35b,
                      "value_type &ImVector<ImGuiIniData>::operator[](int) [T = ImGuiIniData]");
      }
      pIVar2 = (pIVar3->Settings).Data;
      if (*(ImU32 *)((long)&pIVar2->Id + lVar6) == IVar4) {
        return (ImGuiIniData *)((long)&pIVar2->Name + lVar6);
      }
      lVar6 = lVar6 + 0x20;
    } while ((ulong)uVar1 << 5 != lVar6);
  }
  return (ImGuiIniData *)0x0;
}

Assistant:

static ImGuiIniData* FindWindowSettings(const char* name)
{
    ImGuiContext& g = *GImGui;
    ImGuiID id = ImHash(name, 0);
    for (int i = 0; i != g.Settings.Size; i++)
    {
        ImGuiIniData* ini = &g.Settings[i];
        if (ini->Id == id)
            return ini;
    }
    return NULL;
}